

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metrics.cpp
# Opt level: O3

Pass * wasm::createFunctionMetricsPass(void)

{
  undefined1 *puVar1;
  Pass *pPVar2;
  
  pPVar2 = (Pass *)operator_new(0x168);
  pPVar2->runner = (PassRunner *)0x0;
  (pPVar2->name)._M_dataplus._M_p = (pointer)&(pPVar2->name).field_2;
  (pPVar2->name)._M_string_length = 0;
  (pPVar2->name).field_2._M_local_buf[0] = '\0';
  (pPVar2->passArg).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  pPVar2[1]._vptr_Pass = (_func_int **)0x0;
  pPVar2[1].runner = (PassRunner *)0x0;
  pPVar2[3]._vptr_Pass = (_func_int **)0x0;
  pPVar2[3].runner = (PassRunner *)0x0;
  pPVar2[3].name._M_dataplus._M_p = (pointer)0x0;
  pPVar2[3].name._M_string_length = 0;
  pPVar2[3].name.field_2._M_allocated_capacity = 0;
  pPVar2->_vptr_Pass = (_func_int **)&PTR__Metrics_01073d38;
  pPVar2[3].name.field_2._M_local_buf[8] = '\x01';
  puVar1 = (undefined1 *)
           ((long)&pPVar2[3].passArg.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 8);
  *(undefined4 *)
   ((long)&pPVar2[3].passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 8) = 0;
  *(undefined8 *)
   ((long)&pPVar2[3].passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x10) = 0;
  *(undefined1 **)
   ((long)&pPVar2[3].passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x18) = puVar1;
  *(undefined1 **)
   &pPVar2[3].passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = puVar1;
  pPVar2[4]._vptr_Pass = (_func_int **)0x0;
  return pPVar2;
}

Assistant:

Pass* createFunctionMetricsPass() { return new Metrics(true); }